

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Section * __thiscall
asmjit::v1_14::CodeHolder::sectionByName(CodeHolder *this,char *name,size_t nameSize)

{
  FixedString<36UL> *__s1;
  uint uVar1;
  long lVar2;
  Section *pSVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  Section *local_40;
  
  if (nameSize == 0xffffffffffffffff) {
    nameSize = strlen(name);
  }
  if (nameSize < 0x24) {
    uVar1 = *(uint *)&this->field_0xe0;
    bVar7 = (ulong)uVar1 == 0;
    if (!bVar7) {
      lVar2 = *(long *)&this->_sections;
      lVar6 = 0;
      do {
        pSVar3 = *(Section **)(lVar2 + lVar6);
        __s1 = &pSVar3->_name;
        iVar5 = bcmp(__s1,name,nameSize);
        if ((iVar5 == 0) && (__s1->str[nameSize] == '\0')) {
          bVar4 = false;
          local_40 = pSVar3;
        }
        else {
          bVar4 = true;
        }
        if (!bVar4) break;
        lVar6 = lVar6 + 8;
        bVar7 = (ulong)uVar1 << 3 == lVar6;
      } while (!bVar7);
    }
    if (!bVar7) {
      return local_40;
    }
  }
  return (Section *)0x0;
}

Assistant:

Section* CodeHolder::sectionByName(const char* name, size_t nameSize) const noexcept {
  if (nameSize == SIZE_MAX)
    nameSize = strlen(name);

  // This could be also put in a hash-table similarly like we do with labels,
  // however it's questionable as the number of sections should be pretty low
  // in general. Create an issue if this becomes a problem.
  if (nameSize <= Globals::kMaxSectionNameSize) {
    for (Section* section : _sections)
      if (memcmp(section->_name.str, name, nameSize) == 0 && section->_name.str[nameSize] == '\0')
        return section;
  }

  return nullptr;
}